

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::LifetimeTests::details::attacherName_abi_cxx11_
          (string *__return_storage_ptr__,details *this,Attacher *attacher)

{
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined1 local_190 [8];
  ostringstream os;
  Attacher *attacher_local;
  
  os._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pTVar2 = Attacher::getElementType((Attacher *)os._368_8_);
  iVar1 = (*pTVar2->_vptr_Type[7])();
  poVar3 = std::operator<<((ostream *)local_190,(char *)CONCAT44(extraout_var,iVar1));
  poVar3 = std::operator<<(poVar3,"_");
  pTVar2 = Attacher::getContainerType((Attacher *)os._368_8_);
  iVar1 = (*pTVar2->_vptr_Type[7])();
  std::operator<<(poVar3,(char *)CONCAT44(extraout_var_00,iVar1));
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string attacherName (Attacher& attacher)
{
	ostringstream os;
	os << attacher.getElementType().getName() << "_" <<  attacher.getContainerType().getName();
	return os.str();
}